

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestRacingTailCaller>::disposeImpl
          (HeapDisposer<capnp::_::(anonymous_namespace)::TestRacingTailCaller> *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<capnp::_::(anonymous_namespace)::TestRacingTailCaller> *this_local;
  
  if (pointer != (void *)0x0) {
    ::capnp::_::anon_unknown_0::TestRacingTailCaller::~TestRacingTailCaller
              ((TestRacingTailCaller *)pointer);
    operator_delete(pointer,0x20);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }